

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Threading.cpp
# Opt level: O3

bool __thiscall senjo::Thread::Start(Thread *this,_func_void_void_ptr *function,void *param)

{
  int iVar1;
  long *plVar2;
  long lVar3;
  char *pcVar4;
  
  if (function == (_func_void_void_ptr *)0x0) {
    pcVar4 = "NULL thread function";
    lVar3 = 0x14;
  }
  else {
    if (this->running != true) {
      this->threadFunction = function;
      this->threadParam = param;
      iVar1 = pthread_create(&this->thread,(pthread_attr_t *)0x0,RunPThreadFunction,this);
      if (iVar1 == 0) {
        this->running = true;
        return true;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unable to create thread: error code ",0x24);
      plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      lVar3 = *plVar2;
      goto LAB_0013b790;
    }
    pcVar4 = "Thread::Start() already active";
    lVar3 = 0x1e;
  }
  plVar2 = &std::cerr;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,lVar3);
  lVar3 = std::cerr;
LAB_0013b790:
  std::ios::widen((char)*(undefined8 *)(lVar3 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  return false;
}

Assistant:

bool Thread::Start(void (*function)(void*), void* param)
{
  if (!function) {
    std::cerr << "NULL thread function" << std::endl;
    return false;
  }
#ifdef _WIN32
  if (thread) {
    std::cerr << "Thread::Start() already active" << std::endl;
    return false;
  }
  threadFunction = function;
  threadParam = param;
  thread = CreateThread(NULL, 0, (LPTHREAD_START_ROUTINE)RunThreadFunction,
                        (LPVOID)this, 0, &threadID);
  if (!thread) {
    std::cerr << "Unable to create thread: error code " << GetLastError()
              << std::endl;
  }
#else
  if (running) {
    std::cerr << "Thread::Start() already active" << std::endl;
    return false;
  }
  threadFunction = function;
  threadParam = param;
  int err = pthread_create(&thread, NULL, RunPThreadFunction, this);
  if (err) {
    std::cerr << "Unable to create thread: error code " << err
              << std::endl;
    return false;
  }
  running = true;
#endif
  return true;
}